

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

Matrix * __thiscall sptk::Matrix::operator*(Matrix *this,Matrix *matrix)

{
  double dVar1;
  logic_error *this_00;
  const_reference ppdVar2;
  reference ppdVar3;
  long in_RDX;
  Matrix *in_RSI;
  Matrix *in_RDI;
  int k;
  int j;
  int i;
  Matrix *result;
  double dVar4;
  int local_34;
  int local_30;
  int local_2c;
  
  if (in_RSI->num_column_ == *(int *)(in_RDX + 8)) {
    Matrix(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    for (local_2c = 0; local_2c < in_RSI->num_row_; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < *(int *)(in_RDX + 0xc); local_30 = local_30 + 1) {
        for (local_34 = 0; local_34 < in_RSI->num_column_; local_34 = local_34 + 1) {
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              (&in_RSI->index_,(long)local_2c);
          dVar1 = (*ppdVar2)[local_34];
          ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              ((vector<double_*,_std::allocator<double_*>_> *)(in_RDX + 0x28),
                               (long)local_34);
          dVar4 = (*ppdVar2)[local_30];
          ppdVar3 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                              (&in_RDI->index_,(long)local_2c);
          (*ppdVar3)[local_30] = dVar1 * dVar4 + (*ppdVar3)[local_30];
        }
      }
    }
    return in_RDI;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(anonymous_namespace)::kErrorMessageForLogicError);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

Matrix Matrix::operator*(const Matrix& matrix) const {
  if (num_column_ != matrix.num_row_) {
    throw std::logic_error(kErrorMessageForLogicError);
  }
  Matrix result(num_row_, matrix.num_column_);
  for (int i(0); i < num_row_; ++i) {
    for (int j(0); j < matrix.num_column_; ++j) {
      for (int k(0); k < num_column_; ++k) {
        result.index_[i][j] += index_[i][k] * matrix.index_[k][j];
      }
    }
  }
  return result;
}